

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

iterator * __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::end(iterator *__return_storage_ptr__,
     concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
     *this)

{
  __shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->it)._M_node = &(this->map_)._M_t._M_impl.super__Rb_tree_header._M_header;
  Catch::clara::std::__shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(__return_storage_ptr__->lock_ptr).
                  super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
                 ,&local_18);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

iterator        end()                   { return iterator(map_.end()); }